

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<double> fmt::v7::detail::dragonbox::to_decimal<double>(double x)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint128_wrapper *puVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  int iVar20;
  char cVar21;
  int in_ESI;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  decimal_fp<double> dVar29;
  
  uVar27 = (ulong)x & 0xfffffffffffff;
  if (((ulong)x & 0x7ff0000000000000) == 0) {
    uVar28 = 0xfffffbce;
    if (uVar27 == 0) {
      iVar20 = 0;
      uVar22 = 0;
      goto LAB_00115848;
    }
LAB_00115411:
    iVar20 = (int)(uVar28 * 0x134413) >> 0x16;
    iVar18 = iVar20 + -2;
    puVar13 = cache_accessor<double>::get_cached_power
                        ((uint128_wrapper *)(ulong)(2U - iVar20),in_ESI);
    bVar15 = (char)((int)((2U - iVar20) * 0x1a934f) >> 0x13) + (char)uVar28;
    uVar24 = uVar27 * 2;
    lVar1 = uVar27 * 2 + 1;
    uVar22 = lVar1 << (bVar15 & 0x3f);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar22;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = extraout_RDX;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar22;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = puVar13;
    uVar19 = SUB168(auVar3 * auVar8,8) +
             (ulong)CARRY8(SUB168(auVar4 * auVar9,8),SUB168(auVar3 * auVar8,0));
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar19;
    uVar22 = SUB168(auVar5 * ZEXT816(0x83126e978d4fdf3c),8) >> 9;
    uVar12 = (int)uVar22 * -1000;
    uVar14 = (ulong)uVar12;
    uVar12 = (int)uVar19 + uVar12;
    uVar23 = (uint)(extraout_RDX >> (~bVar15 & 0x3f));
    if (uVar12 <= uVar23) {
      if (uVar12 < uVar23) {
        if (((((int)uVar28 < -2) || (uVar12 != 0)) || ((uVar27 & 1) == 0)) ||
           ((9 < (int)uVar28 &&
            ((0x56 < (int)uVar28 ||
             (uVar14 = (long)iVar18 * 0x10,
             uVar19 = lVar1 * *(long *)(basic_data<void>::divtest_table_for_pow5_64 + uVar14),
             *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + uVar14 + 8) <= uVar19 &&
             uVar19 - *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + uVar14 + 8) != 0)))))
           ) {
LAB_00115770:
          uVar28 = (uint)uVar14;
          iVar20 = iVar20 + 1;
          uVar27 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          uVar23 = (uint)uVar27;
          uVar12 = 0x10;
          if (uVar23 < 0x10) {
            uVar12 = uVar23;
          }
          if (7 < uVar27) {
            uVar24 = uVar22 * -0x3898f8b4dd16f1df;
            if (uVar24 < 0x2af31dc46119) {
              uVar22 = uVar24 >> 8;
              uVar25 = (uint)(uVar24 >> 8);
              uVar28 = 8;
              if (uVar23 != 8) {
                uVar26 = 9;
                if (9 < uVar12) {
                  uVar26 = uVar12;
                }
                uVar12 = 8;
                do {
                  uVar17 = (uint)uVar22 * -0x33333333;
                  uVar25 = (uint)uVar22;
                  uVar28 = uVar12;
                  if (0x33333333 < uVar17) break;
                  uVar12 = uVar12 + 1;
                  uVar22 = (ulong)uVar17;
                  uVar25 = uVar17;
                  uVar28 = uVar26;
                } while (uVar26 != uVar12);
              }
              uVar22 = (ulong)(uVar25 >> ((char)uVar28 - 8U & 0x1f));
            }
            if (uVar24 < 0x2af31dc46119) goto LAB_00115846;
          }
          uVar28 = 0;
          if (uVar27 != 0) {
            uVar27 = uVar22 / 100000000;
            iVar18 = (int)uVar27 * -100000000 + (int)uVar22;
            uVar12 = iVar18 * -0x33333333;
            if (uVar12 < 0x33333334) {
              if ((uVar23 == 1) || (uVar28 = iVar18 * -0x3d70a3d7, 0x33333333 < uVar28))
              goto LAB_0011583e;
              if ((uVar23 == 2) || (uVar12 = iVar18 * 0x26e978d5, 0x33333333 < uVar12))
              goto LAB_001158f2;
              if ((uVar23 == 3) || (uVar28 = iVar18 * 0x3afb7e91, 0x33333333 < uVar28))
              goto LAB_0011593d;
              if ((uVar23 == 4) || (uVar12 = iVar18 * 0xbcbe61d, 0x33333333 < uVar12))
              goto LAB_0011598c;
              if ((uVar23 == 5) || (uVar28 = iVar18 * 0x68c26139, 0x33333333 < uVar28))
              goto LAB_001159d7;
              if ((uVar23 != 6) && (uVar12 = iVar18 * -0x5172b95b, uVar12 < 0x33333334))
              goto LAB_00115a3b;
LAB_00115a1c:
              uVar22 = uVar27 * 100 + (ulong)(uVar28 >> 6);
              uVar28 = 6;
            }
          }
          goto LAB_00115846;
        }
        uVar22 = uVar22 - 1;
        uVar12 = 1000;
      }
      else {
        uVar19 = uVar24 - 1;
        if ((((-3 < (int)uVar28) && ((uVar27 & 1) == 0)) &&
            (((int)uVar28 < 10 ||
             (((int)uVar28 < 0x57 &&
              (uVar14 = (long)iVar18 * 0x10,
              *(long *)(basic_data<void>::divtest_table_for_pow5_64 + uVar14) * uVar19 <
              *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + uVar14 + 8) ||
              *(long *)(basic_data<void>::divtest_table_for_pow5_64 + uVar14) * uVar19 -
              *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + uVar14 + 8) == 0)))))) ||
           (auVar6._8_8_ = 0, auVar6._0_8_ = puVar13, auVar10._8_8_ = 0, auVar10._0_8_ = uVar19,
           uVar14 = (ulong)(byte)(0x40 - bVar15),
           (SUB168(auVar6 * auVar10,8) + extraout_RDX * uVar19 >> (uVar14 & 0x3f) & 1) != 0))
        goto LAB_00115770;
      }
    }
    iVar16 = uVar12 - (uVar23 >> 1);
    uVar12 = iVar16 + 0x32;
    if ((uVar12 & 3) == 0) {
      uVar12 = (uVar12 >> 2) * 0xa429;
      uVar22 = uVar22 * 10 + (ulong)(uVar12 >> 0x14);
      if ((uVar12 & 0xff) < 0xb) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = puVar13;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar24;
        if (((SUB168(auVar7 * auVar11,8) + extraout_RDX * uVar24 >>
              ((ulong)(byte)(0x40 - bVar15) & 0x3f) & 1) != 0) == (bool)((byte)iVar16 & 1)) {
          if ((int)uVar28 < 0x57) {
            if ((int)uVar28 < 10) {
              bVar2 = true;
              if ((int)uVar28 < -4) {
                lVar1 = 0;
                if (uVar27 != 0) {
                  for (; (uVar24 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
                  }
                }
                bVar2 = (int)(iVar18 - uVar28) < (int)lVar1;
              }
            }
            else {
              bVar2 = uVar24 * *(long *)(basic_data<void>::divtest_table_for_pow5_64 +
                                        (long)iVar18 * 0x10) <
                      *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 +
                                (long)iVar18 * 0x10 + 8) ||
                      uVar24 * *(long *)(basic_data<void>::divtest_table_for_pow5_64 +
                                        (long)iVar18 * 0x10) -
                      *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 +
                                (long)iVar18 * 0x10 + 8) == 0;
            }
          }
          else {
            bVar2 = false;
          }
          if (bVar2) {
            uVar22 = uVar22 & 0xfffffffffffffffe;
          }
        }
        else {
          uVar22 = uVar22 - 1;
        }
      }
    }
    else {
      uVar22 = uVar22 * 10 + (ulong)(uVar12 * 0xa3d8 >> 0x16);
    }
  }
  else {
    uVar28 = (uint)(((ulong)x & 0x7ff0000000000000) >> 0x34) - 0x433;
    if (uVar27 != 0) {
      uVar27 = uVar27 + 0x10000000000000;
      goto LAB_00115411;
    }
    iVar20 = (int)(uVar28 * 0x134413 + -0x7feff) >> 0x16;
    cVar21 = (char)(iVar20 * -0x1a934f >> 0x13) + (char)uVar28;
    cache_accessor<double>::get_cached_power((uint128_wrapper *)(ulong)(uint)-iVar20,in_ESI);
    bVar15 = 0xb - cVar21;
    uVar24 = (ulong)((uVar28 & 0xfffffffe) != 2) +
             (extraout_RDX_00 - (extraout_RDX_00 >> 0x36) >> (bVar15 & 0x3f));
    uVar22 = ((extraout_RDX_00 >> 0x35) + extraout_RDX_00 >> (bVar15 & 0x3f)) / 10;
    uVar27 = uVar22 * 10;
    if (uVar27 < uVar24) {
      uVar27 = (extraout_RDX_00 >> (10U - cVar21 & 0x3f)) + 1 >> 1;
      if (uVar28 == 0xffffffb3) {
        uVar22 = uVar27 & 0xfffffffffffffffe;
      }
      else {
        uVar22 = uVar27 + (uVar27 < uVar24);
      }
      goto LAB_00115848;
    }
    iVar20 = iVar20 + 1;
    uVar24 = 0;
    if (uVar22 != 0) {
      for (; (uVar22 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
      }
    }
    uVar23 = (uint)uVar24;
    uVar28 = 0x10;
    if (uVar23 < 0x10) {
      uVar28 = uVar23;
    }
    if (uVar24 < 8) {
LAB_001156d9:
      uVar28 = 0;
      if (uVar24 == 0) goto LAB_00115846;
      uVar27 = uVar22 / 100000000;
      iVar18 = (int)uVar27 * -100000000 + (int)uVar22;
      uVar12 = iVar18 * -0x33333333;
      if (0x33333333 < uVar12) goto LAB_00115846;
      if ((uVar23 == 1) || (uVar28 = iVar18 * -0x3d70a3d7, 0x33333333 < uVar28)) {
        uVar27 = uVar27 & 0xffffffff;
LAB_0011583e:
        uVar22 = uVar27 * 10000000 + (ulong)(uVar12 >> 1);
        uVar28 = 1;
      }
      else if ((uVar23 == 2) || (uVar12 = iVar18 * 0x26e978d5, 0x33333333 < uVar12)) {
        uVar27 = uVar27 & 0xffffffff;
LAB_001158f2:
        uVar22 = uVar27 * 1000000 + (ulong)(uVar28 >> 2);
        uVar28 = 2;
      }
      else if ((uVar23 == 3) || (uVar28 = iVar18 * 0x3afb7e91, 0x33333333 < uVar28)) {
        uVar27 = uVar27 & 0xffffffff;
LAB_0011593d:
        uVar22 = uVar27 * 100000 + (ulong)(uVar12 >> 3);
        uVar28 = 3;
      }
      else if ((uVar23 == 4) || (uVar12 = iVar18 * 0xbcbe61d, 0x33333333 < uVar12)) {
        uVar27 = uVar27 & 0xffffffff;
LAB_0011598c:
        uVar22 = uVar27 * 10000 + (ulong)(uVar28 >> 4);
        uVar28 = 4;
      }
      else if ((uVar23 == 5) || (uVar28 = iVar18 * 0x68c26139, 0x33333333 < uVar28)) {
        uVar27 = uVar27 & 0xffffffff;
LAB_001159d7:
        uVar22 = uVar27 * 1000 + (ulong)(uVar12 >> 5);
        uVar28 = 5;
      }
      else {
        if ((uVar23 == 6) || (uVar12 = iVar18 * -0x5172b95b, 0x33333333 < uVar12)) {
          uVar27 = uVar27 & 0xffffffff;
          goto LAB_00115a1c;
        }
        uVar27 = uVar27 & 0xffffffff;
LAB_00115a3b:
        uVar22 = (ulong)(uVar12 >> 7) + uVar27 * 10;
        uVar28 = 7;
      }
    }
    else {
      uVar14 = uVar22 * -0x3898f8b4dd16f1df;
      if (uVar14 < 0x2af31dc46119) {
        uVar22 = uVar14 >> 8;
        uVar27 = 8;
        uVar12 = (uint)(uVar14 >> 8);
        if (uVar23 != 8) {
          uVar25 = 9;
          if (9 < uVar28) {
            uVar25 = uVar28;
          }
          uVar27 = 8;
          do {
            uVar28 = (uint)uVar22 * -0x33333333;
            uVar12 = (uint)uVar22;
            if (0x33333333 < uVar28) goto LAB_001156cb;
            uVar12 = (int)uVar27 + 1;
            uVar27 = (ulong)uVar12;
            uVar22 = (ulong)uVar28;
          } while (uVar25 != uVar12);
          uVar27 = (ulong)uVar25;
          uVar12 = uVar28;
        }
LAB_001156cb:
        uVar22 = (ulong)(uVar12 >> ((char)uVar27 - 8U & 0x1f));
      }
      uVar28 = (uint)uVar27;
      if (0x2af31dc46118 < uVar14) goto LAB_001156d9;
    }
LAB_00115846:
    iVar20 = iVar20 + uVar28;
  }
LAB_00115848:
  dVar29.exponent = iVar20;
  dVar29.significand = uVar22;
  dVar29._12_4_ = 0;
  return dVar29;
}

Assistant:

FMT_SAFEBUFFERS decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}